

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O2

void param_calc(void)

{
  ulong uVar1;
  rpf_t *(*paprVar2) [16];
  ulong uVar3;
  
  paprVar2 = g_Pf;
  for (uVar1 = 0; uVar1 != 0x49; uVar1 = uVar1 + 1) {
    for (uVar3 = 0; uVar3 != 0x10; uVar3 = uVar3 + 1) {
      if ((g_param.motor_enable[uVar3] != 0) && ((*paprVar2)[uVar3] != (rpf_t *)0x0)) {
        formula_eval();
        yprintf(OUTPUT_LV_DEBUG,"Evaluated: [%d][%d] %f\n",uVar1 & 0xffffffff,uVar3 & 0xffffffff);
      }
    }
    paprVar2 = paprVar2 + 1;
  }
  return;
}

Assistant:

void param_calc()
{
  int i, j;
  for (i = 0; i < YP_PARAM_NUM; i++)
  {
    for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
    {
      if (!g_param.motor_enable[j])
        continue;
      if (g_Pf[i][j])
      {
        double d;
        d = formula_eval(g_Pf[i][j]);
        yprintf(OUTPUT_LV_DEBUG, "Evaluated: [%d][%d] %f\n", i, j, d);
      }
    }
  }
}